

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaFixupSimpleTypeStageOne(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  int iVar1;
  xmlSchemaTypePtr type_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  if (((type->type == XML_SCHEMA_TYPE_SIMPLE) && (type->type != XML_SCHEMA_TYPE_BASIC)) &&
     ((type->flags & 0x20000000U) == 0)) {
    type->flags = type->flags | 0x20000000;
    if ((type->flags & 0x40U) == 0) {
      if ((type->flags & 0x80U) == 0) {
        if (type->baseType == (xmlSchemaTypePtr)0x0) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupSimpleTypeStageOne",
                     "type has no base-type assigned");
          return -1;
        }
        if (((type->baseType->type != XML_SCHEMA_TYPE_BASIC) &&
            ((type->baseType->flags & 0x20000000U) == 0)) &&
           (iVar1 = xmlSchemaFixupSimpleTypeStageOne(pctxt,type->baseType), iVar1 == -1)) {
          return -1;
        }
        if ((type->baseType->flags & 0x100U) == 0) {
          if ((type->baseType->flags & 0x40U) == 0) {
            if ((type->baseType->flags & 0x80U) != 0) {
              type->flags = type->flags | 0x80;
            }
          }
          else {
            type->flags = type->flags | 0x40;
            type->subtypes = type->baseType->subtypes;
          }
        }
        else {
          type->flags = type->flags | 0x100;
        }
      }
      else if (type->memberTypes == (xmlSchemaTypeLinkPtr)0x0) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupSimpleTypeStageOne",
                   "union type has no member-types assigned");
        return -1;
      }
    }
    else if (type->subtypes == (xmlSchemaTypePtr)0x0) {
      xmlSchemaInternalErr
                ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupSimpleTypeStageOne",
                 "list type has no item-type assigned");
      return -1;
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaFixupSimpleTypeStageOne(xmlSchemaParserCtxtPtr pctxt,
			  xmlSchemaTypePtr type)
{
    if (type->type != XML_SCHEMA_TYPE_SIMPLE)
	return(0);
    if (! WXS_IS_TYPE_NOT_FIXED_1(type))
	return(0);
    type->flags |= XML_SCHEMAS_TYPE_FIXUP_1;

    if (WXS_IS_LIST(type)) {
	/*
	* Corresponds to <simpleType><list>...
	*/
	if (type->subtypes == NULL) {
	    /*
	    * This one is really needed, so get out.
	    */
	    PERROR_INT("xmlSchemaFixupSimpleTypeStageOne",
		"list type has no item-type assigned");
	    return(-1);
	}
    } else if (WXS_IS_UNION(type)) {
	/*
	* Corresponds to <simpleType><union>...
	*/
	if (type->memberTypes == NULL) {
	    /*
	    * This one is really needed, so get out.
	    */
	    PERROR_INT("xmlSchemaFixupSimpleTypeStageOne",
		"union type has no member-types assigned");
	    return(-1);
	}
    } else {
	/*
	* Corresponds to <simpleType><restriction>...
	*/
	if (type->baseType == NULL) {
	    PERROR_INT("xmlSchemaFixupSimpleTypeStageOne",
		"type has no base-type assigned");
	    return(-1);
	}
	if (WXS_IS_TYPE_NOT_FIXED_1(type->baseType))
	    if (xmlSchemaFixupSimpleTypeStageOne(pctxt, type->baseType) == -1)
		return(-1);
	/*
	* Variety
	* If the <restriction> alternative is chosen, then the
	* {variety} of the {base type definition}.
	*/
	if (WXS_IS_ATOMIC(type->baseType))
	    type->flags |= XML_SCHEMAS_TYPE_VARIETY_ATOMIC;
	else if (WXS_IS_LIST(type->baseType)) {
	    type->flags |= XML_SCHEMAS_TYPE_VARIETY_LIST;
	    /*
	    * Inherit the itemType.
	    */
	    type->subtypes = type->baseType->subtypes;
	} else if (WXS_IS_UNION(type->baseType)) {
	    type->flags |= XML_SCHEMAS_TYPE_VARIETY_UNION;
	    /*
	    * NOTE that we won't assign the memberTypes of the base,
	    * since this will make trouble when freeing them; we will
	    * use a lookup function to access them instead.
	    */
	}
    }
    return(0);
}